

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O1

ram_addr_t qemu_ram_addr_from_host_arm(uc_struct_conflict1 *uc,void *ptr)

{
  ram_addr_t in_RAX;
  RAMBlock *pRVar1;
  ram_addr_t offset;
  ram_addr_t local_8;
  
  local_8 = in_RAX;
  pRVar1 = qemu_ram_block_from_host_arm(uc,ptr,false,&local_8);
  if (pRVar1 == (RAMBlock *)0x0) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    local_8 = local_8 + pRVar1->offset;
  }
  return local_8;
}

Assistant:

ram_addr_t qemu_ram_addr_from_host(struct uc_struct *uc, void *ptr)
{
    RAMBlock *block;
    ram_addr_t offset;

    block = qemu_ram_block_from_host(uc, ptr, false, &offset);
    if (!block) {
        return RAM_ADDR_INVALID;
    }

    return block->offset + offset;
}